

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

ssize_t Executor::read(int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  Var *pVVar2;
  istream *piVar3;
  undefined4 in_register_0000003c;
  string asStackY_28 [4];
  Error in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(CONCAT44(in_register_0000003c,__fd) + 0x10);
  if (*(int *)(lVar1 + 0xc) != 2) {
    reportError(in_stack_ffffffffffffffdc);
  }
  std::__cxx11::string::string(asStackY_28,(string *)(lVar1 + 0x30));
  pVVar2 = getVar((string *)asStackY_28);
  std::__cxx11::string::~string(asStackY_28);
  piVar3 = (istream *)(ulong)pVVar2->kind;
  switch(piVar3) {
  case (istream *)0x0:
    piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)pVVar2);
    break;
  case (istream *)0x1:
    piVar3 = std::istream::_M_extract<float>((float *)&std::cin);
    break;
  case (istream *)0x2:
    piVar3 = std::istream::_M_extract<bool>((bool *)&std::cin);
    break;
  case (istream *)0x3:
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&pVVar2->text);
  }
  return (ssize_t)piVar3;
}

Assistant:

void read(treeNode* node)
    {
        auto id = node->child[0];
        if(id->kind.expKind!=ExpKind::idExp)reportError(Error::lackIdentifiter);
        auto var = getVar(id->text);
        if(var->kind==AttrKind::Text)
            getline(cin,var->text);
        else if(var->kind==AttrKind::Integer)
            cin>>var->value.integer;
        else if(var->kind==AttrKind::Boolean)
            cin>>var->value.boolean;
        else if(var->kind==AttrKind::Decmical)
            cin>>var->value.decmical;
       // cout<<2333333333;
    }